

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int joliet_allowed_char(uchar high,uchar low)

{
  uint uVar1;
  undefined2 local_e;
  int utf16;
  uchar low_local;
  uchar high_local;
  
  local_e = CONCAT11(high,low);
  uVar1 = (uint)local_e;
  if (uVar1 < 0x20) {
    utf16 = 0;
  }
  else if ((((uVar1 == 0x2a) || (uVar1 == 0x2f)) || (uVar1 - 0x3a < 2)) ||
          ((uVar1 == 0x3f || (uVar1 == 0x5c)))) {
    utf16 = 0;
  }
  else {
    utf16 = 1;
  }
  return utf16;
}

Assistant:

static inline int
joliet_allowed_char(unsigned char high, unsigned char low)
{
	int utf16 = (high << 8) | low;

	if (utf16 <= 0x001F)
		return (0);

	switch (utf16) {
	case 0x002A: /* '*' */
	case 0x002F: /* '/' */
	case 0x003A: /* ':' */
	case 0x003B: /* ';' */
	case 0x003F: /* '?' */
	case 0x005C: /* '\' */
		return (0);/* Not allowed. */
	}
	return (1);
}